

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts3SegReaderFinish(Fts3MultiSegReader *pCsr)

{
  int i;
  long lVar1;
  
  if (pCsr != (Fts3MultiSegReader *)0x0) {
    for (lVar1 = 0; lVar1 < pCsr->nSegment; lVar1 = lVar1 + 1) {
      sqlite3Fts3SegReaderFree(pCsr->apSegment[lVar1]);
    }
    sqlite3_free(pCsr->apSegment);
    sqlite3_free(pCsr->aBuffer);
    pCsr->nSegment = 0;
    pCsr->apSegment = (Fts3SegReader **)0x0;
    pCsr->aBuffer = (char *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3SegReaderFinish(
  Fts3MultiSegReader *pCsr       /* Cursor object */
){
  if( pCsr ){
    int i;
    for(i=0; i<pCsr->nSegment; i++){
      sqlite3Fts3SegReaderFree(pCsr->apSegment[i]);
    }
    sqlite3_free(pCsr->apSegment);
    sqlite3_free(pCsr->aBuffer);

    pCsr->nSegment = 0;
    pCsr->apSegment = 0;
    pCsr->aBuffer = 0;
  }
}